

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

UniValue * BIP22ValidationResult(UniValue *__return_storage_ptr__,BlockValidationState *state)

{
  ModeState MVar1;
  string str;
  UniValue *__return_storage_ptr___00;
  string *this;
  long in_FS_OFFSET;
  string strRejectReason;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  this = &strRejectReason;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  MVar1 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  if (MVar1 == M_VALID) {
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    str._M_string_length = strRejectReason._M_string_length;
    str._M_dataplus._M_p = strRejectReason._M_dataplus._M_p;
    str.field_2 = strRejectReason.field_2;
    UniValue::UniValue(__return_storage_ptr__,VNULL,str);
    this = (string *)&local_48;
  }
  else {
    if (MVar1 != M_INVALID) {
      if (MVar1 == M_ERROR) {
        __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  (&strRejectReason,&state->super_ValidationState<BlockValidationResult>);
        JSONRPCError(__return_storage_ptr___00,-0x19,&strRejectReason);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        UniValue::UniValue<const_char_(&)[7],_char[7],_true>
                  (__return_storage_ptr__,(char (*) [7])"valid?");
        return __return_storage_ptr__;
      }
      goto LAB_002c93e4;
    }
    std::__cxx11::string::string
              ((string *)&strRejectReason,
               &(state->super_ValidationState<BlockValidationResult>).m_reject_reason);
    if (strRejectReason._M_string_length == 0) {
      UniValue::UniValue<const_char_(&)[9],_char[9],_true>
                (__return_storage_ptr__,(char (*) [9])0x68a83e);
    }
    else {
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&strRejectReason);
      this = &strRejectReason;
    }
  }
  std::__cxx11::string::~string((string *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_002c93e4:
  __stack_chk_fail();
}

Assistant:

static UniValue BIP22ValidationResult(const BlockValidationState& state)
{
    if (state.IsValid())
        return UniValue::VNULL;

    if (state.IsError())
        throw JSONRPCError(RPC_VERIFY_ERROR, state.ToString());
    if (state.IsInvalid())
    {
        std::string strRejectReason = state.GetRejectReason();
        if (strRejectReason.empty())
            return "rejected";
        return strRejectReason;
    }
    // Should be impossible
    return "valid?";
}